

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.cc
# Opt level: O0

void __thiscall leveldb::VersionEdit::EncodeTo(VersionEdit *this,string *dst)

{
  long lVar1;
  bool bVar2;
  size_type sVar3;
  string *psVar4;
  string *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  FileMetaData *f;
  size_t i_1;
  pair<int,_unsigned_long> *deleted_file_kvp;
  DeletedFileSet *__range1;
  size_t i;
  iterator __end1;
  iterator __begin1;
  string *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff40;
  string *dst_00;
  string *in_stack_ffffffffffffff48;
  string *local_88;
  ulong local_70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 0x40) & 1) != 0) {
    PutVarint32(in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    Slice::Slice((Slice *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    PutLengthPrefixedSlice(in_stack_ffffffffffffff48,(Slice *)in_stack_ffffffffffffff40);
  }
  if ((*(byte *)(in_RDI + 0x41) & 1) != 0) {
    PutVarint32(in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    PutVarint64(in_stack_ffffffffffffff38,(uint64_t)in_stack_ffffffffffffff30);
  }
  if ((*(byte *)(in_RDI + 0x42) & 1) != 0) {
    PutVarint32(in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    PutVarint64(in_stack_ffffffffffffff38,(uint64_t)in_stack_ffffffffffffff30);
  }
  if ((*(byte *)(in_RDI + 0x43) & 1) != 0) {
    PutVarint32(in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    PutVarint64(in_stack_ffffffffffffff38,(uint64_t)in_stack_ffffffffffffff30);
  }
  if ((*(byte *)(in_RDI + 0x44) & 1) != 0) {
    PutVarint32(in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    PutVarint64(in_stack_ffffffffffffff38,(uint64_t)in_stack_ffffffffffffff30);
  }
  local_70 = 0;
  while( true ) {
    sVar3 = std::
            vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
            ::size((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                    *)in_stack_ffffffffffffff28);
    if (sVar3 <= local_70) break;
    PutVarint32(in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    in_stack_ffffffffffffff48 = in_RSI;
    std::
    vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
    ::operator[]((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                  *)in_stack_ffffffffffffff38,(size_type)in_stack_ffffffffffffff30);
    PutVarint32(in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    std::
    vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
    ::operator[]((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                  *)in_stack_ffffffffffffff38,(size_type)in_stack_ffffffffffffff30);
    InternalKey::Encode((InternalKey *)in_stack_ffffffffffffff38);
    PutLengthPrefixedSlice(in_stack_ffffffffffffff48,(Slice *)in_stack_ffffffffffffff40);
    local_70 = local_70 + 1;
  }
  std::
  set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
  ::begin((set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
           *)in_stack_ffffffffffffff30);
  std::
  set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
  ::end((set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
         *)in_stack_ffffffffffffff30);
  while( true ) {
    bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff38,(_Self *)in_stack_ffffffffffffff30);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    std::_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_>::operator*
              ((_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_> *)in_stack_ffffffffffffff28)
    ;
    PutVarint32(in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    PutVarint32(in_stack_ffffffffffffff40,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    PutVarint64(in_stack_ffffffffffffff38,(uint64_t)in_stack_ffffffffffffff30);
    std::_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_> *)in_stack_ffffffffffffff28)
    ;
  }
  local_88 = (string *)0x0;
  while( true ) {
    dst_00 = local_88;
    psVar4 = (string *)
             std::
             vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ::size((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                     *)in_stack_ffffffffffffff28);
    if (psVar4 <= dst_00) break;
    std::
    vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
    ::operator[]((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                  *)in_stack_ffffffffffffff38,(size_type)in_stack_ffffffffffffff30);
    PutVarint32(dst_00,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    in_stack_ffffffffffffff28 = in_RSI;
    std::
    vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
    ::operator[]((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                  *)in_stack_ffffffffffffff38,(size_type)in_stack_ffffffffffffff30);
    PutVarint32(dst_00,(uint32_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    PutVarint64(in_stack_ffffffffffffff38,(uint64_t)in_stack_ffffffffffffff30);
    PutVarint64(in_stack_ffffffffffffff38,(uint64_t)in_stack_ffffffffffffff30);
    in_stack_ffffffffffffff30 = in_RSI;
    InternalKey::Encode((InternalKey *)in_stack_ffffffffffffff38);
    PutLengthPrefixedSlice(in_stack_ffffffffffffff48,(Slice *)dst_00);
    in_stack_ffffffffffffff38 = in_RSI;
    InternalKey::Encode((InternalKey *)in_RSI);
    PutLengthPrefixedSlice(in_stack_ffffffffffffff48,(Slice *)dst_00);
    local_88 = (string *)((long)&(local_88->_M_dataplus)._M_p + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VersionEdit::EncodeTo(std::string* dst) const {
  if (has_comparator_) {
    PutVarint32(dst, kComparator);
    PutLengthPrefixedSlice(dst, comparator_);
  }
  if (has_log_number_) {
    PutVarint32(dst, kLogNumber);
    PutVarint64(dst, log_number_);
  }
  if (has_prev_log_number_) {
    PutVarint32(dst, kPrevLogNumber);
    PutVarint64(dst, prev_log_number_);
  }
  if (has_next_file_number_) {
    PutVarint32(dst, kNextFileNumber);
    PutVarint64(dst, next_file_number_);
  }
  if (has_last_sequence_) {
    PutVarint32(dst, kLastSequence);
    PutVarint64(dst, last_sequence_);
  }

  for (size_t i = 0; i < compact_pointers_.size(); i++) {
    PutVarint32(dst, kCompactPointer);
    PutVarint32(dst, compact_pointers_[i].first);  // level
    PutLengthPrefixedSlice(dst, compact_pointers_[i].second.Encode());
  }

  for (const auto& deleted_file_kvp : deleted_files_) {
    PutVarint32(dst, kDeletedFile);
    PutVarint32(dst, deleted_file_kvp.first);   // level
    PutVarint64(dst, deleted_file_kvp.second);  // file number
  }

  for (size_t i = 0; i < new_files_.size(); i++) {
    const FileMetaData& f = new_files_[i].second;
    PutVarint32(dst, kNewFile);
    PutVarint32(dst, new_files_[i].first);  // level
    PutVarint64(dst, f.number);
    PutVarint64(dst, f.file_size);
    PutLengthPrefixedSlice(dst, f.smallest.Encode());
    PutLengthPrefixedSlice(dst, f.largest.Encode());
  }
}